

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O0

bool __thiscall cmSetPropertyCommand::HandleCacheEntry(cmSetPropertyCommand *this,string *cacheKey)

{
  cmState *pcVar1;
  char *pcVar2;
  char *pcVar3;
  cmState *pcVar4;
  allocator local_101;
  string local_100;
  allocator local_d9;
  string local_d8;
  allocator local_b1;
  string local_b0;
  allocator local_89;
  string local_88;
  allocator local_51;
  string local_50;
  cmState *local_30;
  cmState *state;
  char *value;
  char *name;
  string *cacheKey_local;
  cmSetPropertyCommand *this_local;
  
  name = (char *)cacheKey;
  cacheKey_local = (string *)this;
  value = (char *)std::__cxx11::string::c_str();
  state = (cmState *)std::__cxx11::string::c_str();
  pcVar4 = cmMakefile::GetState((this->super_cmCommand).Makefile);
  pcVar3 = name;
  pcVar2 = value;
  local_30 = pcVar4;
  if ((this->Remove & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_50,pcVar2,&local_51);
    cmState::RemoveCacheEntryProperty(pcVar4,(string *)pcVar3,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
  }
  pcVar3 = name;
  pcVar2 = value;
  pcVar4 = local_30;
  if ((this->AppendMode & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_d8,pcVar2,&local_d9);
    pcVar1 = state;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_100,(char *)pcVar1,&local_101);
    cmState::SetCacheEntryProperty(pcVar4,(string *)pcVar3,&local_d8,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_88,pcVar2,&local_89);
    pcVar1 = state;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b0,(char *)pcVar1,&local_b1);
    cmState::AppendCacheEntryProperty
              (pcVar4,(string *)pcVar3,&local_88,&local_b0,(bool)(this->AppendAsString & 1));
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
  }
  return true;
}

Assistant:

bool cmSetPropertyCommand::HandleCacheEntry(std::string const& cacheKey)
{
  // Set or append the property.
  const char* name = this->PropertyName.c_str();
  const char* value = this->PropertyValue.c_str();
  cmState* state = this->Makefile->GetState();
  if (this->Remove)
    {
    state->RemoveCacheEntryProperty(cacheKey, name);
    }
  if(this->AppendMode)
    {
    state->AppendCacheEntryProperty(cacheKey, name, value,
                                     this->AppendAsString);
    }
  else
    {
    state->SetCacheEntryProperty(cacheKey, name, value);
    }

  return true;
}